

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  PathDescriptionSyntax *args_1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_4;
  PathDeclarationSyntax *pPVar1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  args_1 = (PathDescriptionSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x50),&visitor,(BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  args_4 = deepClone<slang::syntax::ExpressionSyntax>
                     ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)(__fn + 0x78),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0xb0),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0xc0),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::PathDescriptionSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,args_1,(Token *)&visitor,&local_40,args_4,
                      &local_50,&local_60);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PathDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PathDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<PathDescriptionSyntax>(*node.desc, alloc),
        node.equals.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone(node.delays, alloc),
        node.closeParen.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}